

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void solitary(tgestate_t *state)

{
  item_t iVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  char cVar5;
  itemstruct_t *piVar6;
  
  state->bell = 0xff;
  iVar1 = state->items_held[0];
  state->items_held[0] = 0xff;
  item_discovered(state,iVar1);
  iVar1 = state->items_held[1];
  state->items_held[1] = 0xff;
  item_discovered(state,iVar1);
  draw_item(state,state->items_held[0],0x1087);
  draw_item(state,state->items_held[1],0x108a);
  piVar6 = state->item_structs;
  cVar5 = '\x10';
  do {
    if ((piVar6->room_and_flags & 0x3f) == 0) {
      bVar3 = (piVar6->mappos).u;
      lVar4 = 0;
      do {
        if ((((within_camp_bounds::permitted_bounds[lVar4].x0 <= bVar3) &&
             (bVar3 < within_camp_bounds::permitted_bounds[lVar4].x1)) &&
            (bVar2 = (piVar6->mappos).v, within_camp_bounds::permitted_bounds[lVar4].y0 <= bVar2))
           && (bVar2 < within_camp_bounds::permitted_bounds[lVar4].y1)) {
          item_discovered(state,piVar6->item_and_flags);
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    piVar6 = piVar6 + 1;
    cVar5 = cVar5 + -1;
    if (cVar5 == '\0') {
      state->vischars[0].room = '\x18';
      state->current_door = '\x14';
      bVar3 = 0x23;
      if (0x23 < state->morale) {
        bVar3 = state->morale;
      }
      state->morale = bVar3 - 0x23;
      reset_map_and_characters(state);
      state->character_structs[0].route.index = '$';
      state->character_structs[0].route.step = '\0';
      state->character_structs[0].room = '\0';
      state->character_structs[0].mappos.u = 't';
      state->character_structs[0].mappos.v = 'd';
      state->character_structs[0].mappos.w = '\x03';
      queue_message(state,message_YOU_ARE_IN_SOLITARY);
      queue_message(state,message_WAIT_FOR_RELEASE);
      queue_message(state,message_ANOTHER_DAY_DAWNS);
      state->automatic_player_counter = '\0';
      state->in_solitary = 0xff;
      state->vischars[0].mi.sprite = sprites + 2;
      state->IY = state->vischars;
      state->vischars[0].direction = '\x03';
      state->vischars[0].route.index = '\0';
      transition(state,&solitary::solitary_pos);
      return;
    }
  } while( true );
}

Assistant:

void solitary(tgestate_t *state)
{
  /**
   * $7AC6: Solitary map position.
   */
  static const mappos8_t solitary_pos =
  {
    58, 42, 24
  };

  /**
   * $CC31: Partial character struct.
   */
  static const characterstruct_t commandant_reset_data =
  {
    0,               /* character_and_flags */
    room_0_OUTDOORS, /* room */
    { 116, 100, 3 }, /* pos */
    { 36, 0 }        /* route */
  };

  item_t       *pitem;       /* was HL */
  item_t        item;        /* was C */
  uint8_t       iters;       /* was B */
  vischar_t    *vischar;     /* was IY */
  itemstruct_t *pitemstruct; /* was HL */

  assert(state != NULL);

  /* Silence the bell. */
  state->bell = bell_STOP;

  /* Seize the hero's held items. */
  pitem = &state->items_held[0];
  item = *pitem;
  *pitem = item_NONE;
  item_discovered(state, item);

  pitem = &state->items_held[1];
  item = *pitem;
  *pitem = item_NONE;
  item_discovered(state, item);

  draw_all_items(state);

  /* Discover all items. */
  iters = item__LIMIT;
  pitemstruct = &state->item_structs[0];
  do
  {
    /* Is the item outdoors? */
    if ((pitemstruct->room_and_flags & itemstruct_ROOM_MASK) == room_0_OUTDOORS)
    {
      item_t     item_and_flags; /* was A */
      mappos8_t *itempos;        /* was HL */
      uint8_t    area;           /* was A' */

      item_and_flags = pitemstruct->item_and_flags;
      itempos = &pitemstruct->mappos;
      area = 0; /* iterate 0,1,2 */
      do
        /* If the item is within the camp bounds then it will be discovered.
         */
        if (within_camp_bounds(area, itempos))
          goto discovered;
      while (++area != 3);

      goto next;

discovered:
      item_discovered(state, item_and_flags);
    }

next:
    pitemstruct++;
  }
  while (--iters);

  /* Move the hero to solitary. */
  state->vischars[0].room = room_24_SOLITARY;

  /* I reckon this should be 24 which is the door between room_22_REDKEY and
   * room_24_SOLITARY. */
  state->current_door = 20;

  decrease_morale(state, 35);

  reset_map_and_characters(state);

  /* Set the commandant on a path which results in the hero being released. */
  memcpy(&state->character_structs[character_0_COMMANDANT].room,
         &commandant_reset_data.room,
         sizeof(characterstruct_t) - offsetof(characterstruct_t, room));

  /* Queue solitary messages. */
  queue_message(state, message_YOU_ARE_IN_SOLITARY);
  queue_message(state, message_WAIT_FOR_RELEASE);
  queue_message(state, message_ANOTHER_DAY_DAWNS);

  state->in_solitary = 255; /* inhibit user input */
  state->automatic_player_counter = 0; /* immediately take automatic control of hero */
  state->vischars[0].mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];
  vischar = &state->vischars[0];
  state->IY = &state->vischars[0];
  vischar->direction = direction_BOTTOM_LEFT;
  state->vischars[0].route.index = routeindex_0_HALT; /* Stand still. */ // stores a byte, not a word
  transition(state, &solitary_pos);

  NEVER_RETURNS;
}